

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplaceRealloc<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,pointer pos,
          DefinitionSymbol *args,SourceRange *args_1)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pTVar4;
  long lVar5;
  pointer pTVar6;
  iterator pTVar7;
  SourceRange *in_RCX;
  DefinitionSymbol *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  TopCell *in_stack_ffffffffffffff80;
  TopCell *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  iterator __first;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *in_stack_ffffffffffffff98;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *)0xa092d9);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  __first = in_RSI;
  pTVar4 = begin(in_RDI);
  lVar5 = (long)__first - (long)pTVar4;
  pTVar6 = (pointer)operator_new(0xa09338);
  ast::ConfigBlockSymbol::TopCell::TopCell(pTVar6 + (lVar5 >> 5),in_RDX,*in_RCX);
  pTVar4 = in_RSI;
  pTVar7 = end(in_RDI);
  if (pTVar4 == pTVar7) {
    pTVar7 = begin(in_RDI);
    pTVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::ConfigBlockSymbol::TopCell*,slang::ast::ConfigBlockSymbol::TopCell*>
              (__first,pTVar7,in_stack_ffffffffffffff80);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::ConfigBlockSymbol::TopCell*,slang::ast::ConfigBlockSymbol::TopCell*>
              (__first,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    pTVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::ConfigBlockSymbol::TopCell*,slang::ast::ConfigBlockSymbol::TopCell*>
              (__first,in_stack_ffffffffffffff88,in_RSI);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pTVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pTVar6;
  return pTVar6 + (lVar5 >> 5);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}